

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryArticulatedSystemsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryArticulatedSystemsLoader::begin__axis_info____kinematics_axis_info_type
          (LibraryArticulatedSystemsLoader *this,
          axis_info____kinematics_axis_info_type__AttributeData *attributeData)

{
  value_type *__x;
  reference pvVar1;
  long in_RSI;
  long in_RDI;
  AxisInfo *this_00;
  String *in_stack_fffffffffffffeb8;
  SidAddress *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  
  if (*(long *)(in_RSI + 0x10) != 0) {
    __x = (value_type *)
          KinematicsController::getAxisInfos(*(KinematicsController **)(in_RDI + 0x60));
    this_00 = *(AxisInfo **)(in_RSI + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (allocator<char> *)in_stack_fffffffffffffec0);
    SidAddress::SidAddress(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    AxisInfo::AxisInfo(this_00,(SidAddress *)__x);
    std::vector<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_>::push_back
              ((vector<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_> *)this_00,
               __x);
    AxisInfo::~AxisInfo((AxisInfo *)0xc2fa44);
    SidAddress::~SidAddress((SidAddress *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffebf);
    KinematicsController::getAxisInfos(*(KinematicsController **)(in_RDI + 0x60));
    pvVar1 = std::vector<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_>::back
                       ((vector<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_> *
                        )this_00);
    *(reference *)(in_RDI + 200) = pvVar1;
    IFilePartLoader::addToSidTree((IFilePartLoader *)this_00,(char *)__x,(char *)0xc2fa98);
  }
  return true;
}

Assistant:

bool LibraryArticulatedSystemsLoader::begin__axis_info____kinematics_axis_info_type( const axis_info____kinematics_axis_info_type__AttributeData& attributeData )
	{
		if ( attributeData.axis )
		{
			mCurrentKinematicsController->getAxisInfos().push_back(AxisInfo(SidAddress(String(attributeData.axis))));
			mCurrentAxisInfo = &mCurrentKinematicsController->getAxisInfos().back();
			addToSidTree( 0, attributeData.sid );
		}
		return true;
	}